

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

bool __thiscall
MakefileGenerator::processPrlFile(MakefileGenerator *this,QString *file,bool baseOnly)

{
  char16_t *pcVar1;
  qsizetype originalLength;
  char cVar2;
  undefined1 uVar3;
  CutResult CVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  storage_type_conflict *psVar8;
  undefined7 in_register_00000011;
  QString *pQVar9;
  undefined1 *puVar10;
  int iVar11;
  long in_FS_OFFSET;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringBuilder<QString_&,_QString_&> local_80;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  fileFixify(&local_58,this,file,(FileFixifyTypes)0x3,true);
  if (((int)CONCAT71(in_register_00000011,baseOnly) == 0) &&
     (cVar2 = QString::endsWith((QString *)&local_58,0x2e5a40), cVar2 != '\0')) {
    uVar3 = processPrlFileCore(this,file,(QStringView)ZEXT816(0),&local_58);
  }
  else {
    local_80.b = &Option::prl_ext;
    local_80.a = &local_58;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>(&local_70,&local_80);
    uVar3 = processPrlFileCore(this,file,(QStringView)ZEXT816(0),&local_70);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    originalLength = local_58.d.size;
    pcVar1 = local_58.d.ptr;
    if (!baseOnly && !(bool)uVar3) {
      QVar12.m_data = local_58.d.ptr;
      QVar12.m_size = local_58.d.size;
      lVar6 = QtPrivate::lastIndexOf(QVar12,-1,L'/',CaseSensitive);
      QVar13.m_data = pcVar1;
      QVar13.m_size = originalLength;
      lVar7 = QtPrivate::lastIndexOf(QVar13,-1,L'\\',CaseSensitive);
      iVar11 = (int)lVar7;
      if (lVar7 < lVar6) {
        iVar11 = (int)lVar6;
      }
      iVar11 = iVar11 + 1;
      local_80.a = (QString *)0xffffffffffffffff;
      local_70.d.d = (Data *)(long)iVar11;
      CVar4 = QtPrivate::QContainerImplHelper::mid
                        (originalLength,(qsizetype *)&local_70,(qsizetype *)&local_80);
      uVar3 = 0;
      if (CVar4 == Null) {
        pQVar9 = (QString *)0x0;
        psVar8 = (storage_type_conflict *)0x0;
      }
      else {
        psVar8 = pcVar1 + (long)local_70.d.d;
        pQVar9 = local_80.a;
      }
      QVar14.m_data = psVar8;
      QVar14.m_size = (qsizetype)pQVar9;
      iVar5 = QtPrivate::lastIndexOf(QVar14,-1,L'.',CaseSensitive);
      pcVar1 = local_58.d.ptr;
      if (iVar5 != -1) {
        local_80.a = (QString *)0xffffffffffffffff;
        local_70.d.d = (Data *)(long)iVar11;
        CVar4 = QtPrivate::QContainerImplHelper::mid
                          (local_58.d.size,(qsizetype *)&local_70,(qsizetype *)&local_80);
        if (CVar4 == Null) {
          pQVar9 = (QString *)0x0;
          psVar8 = (storage_type_conflict *)0x0;
        }
        else {
          psVar8 = pcVar1 + (long)local_70.d.d;
          pQVar9 = local_80.a;
        }
        puVar10 = (undefined1 *)(long)(iVar11 + iVar5);
        if ((ulong)local_58.d.size < (undefined1 *)(long)(iVar11 + iVar5)) {
          puVar10 = (undefined1 *)local_58.d.size;
        }
        iVar11 = (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x19])
                           (this,file,pQVar9,psVar8,puVar10,local_58.d.ptr,iVar11);
        uVar3 = (undefined1)iVar11;
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

bool
MakefileGenerator::processPrlFile(QString &file, bool baseOnly)
{
    QString f = fileFixify(file, FileFixifyBackwards);
    // Explicitly given full .prl name
    if (!baseOnly && f.endsWith(Option::prl_ext))
        return processPrlFileCore(file, QStringView(), f);
    // Explicitly given or derived (from -l) base name
    if (processPrlFileCore(file, QStringView(), f + Option::prl_ext))
        return true;
    if (!baseOnly) {
        // Explicitly given full library name
        int off = qMax(f.lastIndexOf('/'), f.lastIndexOf('\\')) + 1;
        int ext = QStringView(f).mid(off).lastIndexOf('.');
        if (ext != -1)
            return processPrlFileBase(file, QStringView(f).mid(off), QStringView{f}.left(off + ext), off);
    }
    return false;
}